

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterInit(Fts5Index *p,Fts5StructureSegment *pSeg,Fts5SegIter *pIter)

{
  code *pcVar1;
  
  if ((pSeg->pgnoFirst != 0) && (p->rc == 0)) {
    (pIter->term).n = 0;
    (pIter->term).nSpace = 0;
    pIter->iRowid = 0;
    pIter->pDlidx = (Fts5DlidxIter *)0x0;
    (pIter->term).p = (u8 *)0x0;
    pIter->iRowidOffset = 0;
    pIter->nRowidOffset = 0;
    pIter->aRowidOffset = (int *)0x0;
    pIter->iTermLeafPgno = 0;
    pIter->iTermLeafOffset = 0;
    pIter->iPgidxOff = 0;
    pIter->iEndofDoclist = 0;
    *(undefined8 *)&pIter->iLeafOffset = 0;
    pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
    pIter->pLeaf = (Fts5Data *)0x0;
    pIter->pNextLeaf = (Fts5Data *)0x0;
    pIter->pSeg = (Fts5StructureSegment *)0x0;
    pIter->flags = 0;
    pIter->iLeafPgno = 0;
    pIter->nPos = 0;
    pIter->bDel = '\0';
    *(undefined3 *)&pIter->field_0x75 = 0;
    pcVar1 = fts5SegIterNext;
    if (p->pConfig->eDetail == 1) {
      pcVar1 = fts5SegIterNext_None;
    }
    pIter->xNext = pcVar1;
    pIter->pSeg = pSeg;
    pIter->iLeafPgno = pSeg->pgnoFirst + -1;
    fts5SegIterNextPage(p,pIter);
    if (p->rc == 0) {
      pIter->iLeafOffset = 4;
      pIter->iPgidxOff = pIter->pLeaf->szLeaf + 1;
      fts5SegIterLoadTerm(p,pIter,0);
      fts5SegIterLoadNPos(p,pIter);
      return;
    }
  }
  return;
}

Assistant:

static void fts5SegIterInit(
  Fts5Index *p,                   /* FTS index object */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  if( pSeg->pgnoFirst==0 ){
    /* This happens if the segment is being used as an input to an incremental
    ** merge and all data has already been "trimmed". See function
    ** fts5TrimSegments() for details. In this case leave the iterator empty.
    ** The caller will see the (pIter->pLeaf==0) and assume the iterator is
    ** at EOF already. */
    assert( pIter->pLeaf==0 );
    return;
  }

  if( p->rc==SQLITE_OK ){
    memset(pIter, 0, sizeof(*pIter));
    fts5SegIterSetNext(p, pIter);
    pIter->pSeg = pSeg;
    pIter->iLeafPgno = pSeg->pgnoFirst-1;
    fts5SegIterNextPage(p, pIter);
  }

  if( p->rc==SQLITE_OK ){
    pIter->iLeafOffset = 4;
    assert_nc( pIter->pLeaf->nn>4 );
    assert_nc( fts5LeafFirstTermOff(pIter->pLeaf)==4 );
    pIter->iPgidxOff = pIter->pLeaf->szLeaf+1;
    fts5SegIterLoadTerm(p, pIter, 0);
    fts5SegIterLoadNPos(p, pIter);
  }
}